

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

optional<tinyusdz::Path> * __thiscall
tinyusdz::crate::CrateReader::GetElementPath
          (optional<tinyusdz::Path> *__return_storage_ptr__,CrateReader *this,Index index)

{
  size_type sVar1;
  const_reference value;
  CrateReader *this_local;
  Index index_local;
  
  sVar1 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_elemPaths);
  if (index.value < sVar1) {
    value = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                      (&this->_elemPaths,(ulong)index.value);
    nonstd::optional_lite::optional<tinyusdz::Path>::optional<const_tinyusdz::Path_&,_0>
              (__return_storage_ptr__,value);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Path>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Path> CrateReader::GetElementPath(crate::Index index) const {
  if (index.value < _elemPaths.size()) {
    // ok
  } else {
    return nonstd::nullopt;
  }

  return _elemPaths[index.value];
}